

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_ostream.cpp
# Opt level: O2

void __thiscall
pstore::exchange::export_ns::ostream_base::ostream_base(ostream_base *this,size_t buffer_size)

{
  pointer pcVar1;
  
  this->_vptr_ostream_base = (_func_int **)&PTR___cxa_pure_virtual_0013d320;
  if (0x7ffffffffffffffe < buffer_size) {
    buffer_size = 0x7fffffffffffffff;
  }
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->ptr_ = (char *)0x0;
  this->end_ = (char *)0x0;
  std::vector<char,_std::allocator<char>_>::resize(&this->buffer_,buffer_size);
  pcVar1 = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  this->ptr_ = (this->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
  this->end_ = pcVar1;
  return;
}

Assistant:

ostream_base::ostream_base (std::size_t const buffer_size) {
                buffer_.resize (
                    std::min (buffer_size,
                              unsigned_cast (
                                  std::numeric_limits<gsl::span<char const>::index_type>::max ())));
                ptr_ = buffer_.data ();
                end_ = ptr_ + buffer_.size ();
            }